

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::RegisterDnssecUsageByPrefix
          (DnsStats *this,BinHash<DnssecPrefixEntry> *dnssecTable,uint8_t *prefix,
          size_t prefix_length,bool is_dnssec)

{
  bool stored;
  DnssecPrefixEntry local_38;
  
  local_38.HashNext = (DnssecPrefixEntry *)0x0;
  local_38.hash = 0;
  local_38.prefix_data = (uint8_t *)0x0;
  stored = false;
  local_38.prefix = prefix;
  local_38.prefix_len = prefix_length;
  local_38.is_dnssec = is_dnssec;
  BinHash<DnssecPrefixEntry>::InsertOrAdd(dnssecTable,&local_38,true,&stored);
  DnssecPrefixEntry::~DnssecPrefixEntry(&local_38);
  return;
}

Assistant:

void DnsStats::RegisterDnssecUsageByPrefix(
    BinHash<DnssecPrefixEntry> * dnssecTable,
    uint8_t * prefix, size_t prefix_length, bool is_dnssec)
{
    DnssecPrefixEntry dpe;
    bool stored = false;

    dpe.prefix = prefix;
    dpe.prefix_len = prefix_length;
    dpe.is_dnssec = is_dnssec;

    dnssecTable->InsertOrAdd(&dpe, true, &stored);
}